

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

pair<unsigned_long,_bool> __thiscall
google::protobuf::io::CodedInputStream::ReadVarint64Fallback(CodedInputStream *this)

{
  int iVar1;
  LogMessage *other;
  pair<int,_bool> pVar2;
  undefined8 extraout_RDX;
  pair<bool,_const_unsigned_char_*> pVar3;
  pair<unsigned_long,_bool> pVar4;
  pair<unsigned_long,_bool> pVar5;
  bool local_f1;
  bool success;
  uint64_t temp_1;
  bool local_d6;
  bool local_d5;
  int local_d4;
  pair<int,_bool> local_d0;
  byte local_c8;
  pair<bool,_const_unsigned_char_*> p;
  uint64_t temp;
  CodedInputStream *this_local;
  bool local_a0;
  bool local_91;
  byte *local_90;
  bool local_81;
  uint8_t *local_80;
  uint8_t *next;
  byte local_61;
  LogMessage local_60;
  uchar **local_28;
  byte *local_20;
  byte local_18;
  uint8_t *local_10;
  
  iVar1 = BufferSize(this);
  if ((iVar1 < 10) &&
     ((this->buffer_end_ <= this->buffer_ || ((this->buffer_end_[-1] & 0x80) != 0)))) {
    local_f1 = ReadVarint64Slow(this,(uint64_t *)&stack0xffffffffffffff10);
    pVar4 = std::make_pair<unsigned_long&,bool&>
                      ((unsigned_long *)&stack0xffffffffffffff10,&local_f1);
    local_a0 = pVar4.second;
    goto LAB_004fbf09;
  }
  local_20 = this->buffer_;
  local_28 = &p.second;
  local_61 = 0;
  if (*local_20 < 0x80) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x1a1);
    local_61 = 1;
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (buffer[0]) >= (128): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&next + 3),other);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  if (local_20[1] < 0x80) {
    local_80 = (anonymous_namespace)::DecodeVarint64KnownSize<2ul>(local_20,(uint64_t *)local_28);
LAB_004fbdd2:
    local_91 = true;
    pVar3 = std::make_pair<bool,unsigned_char_const*&>(&local_91,&local_80);
    local_10 = pVar3.second;
    local_18 = pVar3.first;
  }
  else {
    if (local_20[2] < 0x80) {
      local_80 = (anonymous_namespace)::DecodeVarint64KnownSize<3ul>(local_20,(uint64_t *)local_28);
      goto LAB_004fbdd2;
    }
    if (local_20[3] < 0x80) {
      local_80 = (anonymous_namespace)::DecodeVarint64KnownSize<4ul>(local_20,(uint64_t *)local_28);
      goto LAB_004fbdd2;
    }
    if (local_20[4] < 0x80) {
      local_80 = (anonymous_namespace)::DecodeVarint64KnownSize<5ul>(local_20,(uint64_t *)local_28);
      goto LAB_004fbdd2;
    }
    if (local_20[5] < 0x80) {
      local_80 = (anonymous_namespace)::DecodeVarint64KnownSize<6ul>(local_20,(uint64_t *)local_28);
      goto LAB_004fbdd2;
    }
    if (local_20[6] < 0x80) {
      local_80 = (anonymous_namespace)::DecodeVarint64KnownSize<7ul>(local_20,(uint64_t *)local_28);
      goto LAB_004fbdd2;
    }
    if (local_20[7] < 0x80) {
      local_80 = (anonymous_namespace)::DecodeVarint64KnownSize<8ul>(local_20,(uint64_t *)local_28);
      goto LAB_004fbdd2;
    }
    if (local_20[8] < 0x80) {
      local_80 = (anonymous_namespace)::DecodeVarint64KnownSize<9ul>(local_20,(uint64_t *)local_28);
      goto LAB_004fbdd2;
    }
    if (local_20[9] < 0x80) {
      local_80 = (anonymous_namespace)::DecodeVarint64KnownSize<10ul>(local_20,(uint64_t *)local_28)
      ;
      goto LAB_004fbdd2;
    }
    local_81 = false;
    local_90 = local_20 + 0xb;
    pVar3 = std::make_pair<bool,unsigned_char_const*>(&local_81,&local_90);
    local_10 = pVar3.second;
    local_18 = pVar3.first;
  }
  local_c8 = local_18;
  p._0_8_ = local_10;
  if ((local_18 & 1) == 0) {
    local_d4 = 0;
    local_d5 = false;
    pVar2 = std::make_pair<int,bool>(&local_d4,&local_d5);
    local_d0.first = pVar2.first;
    local_d0.second = pVar2.second;
    std::pair<unsigned_long,_bool>::pair<int,_bool,_true>
              ((pair<unsigned_long,_bool> *)&this_local,&local_d0);
    pVar4._8_8_ = extraout_RDX;
    pVar4.first = (unsigned_long)this_local;
  }
  else {
    this->buffer_ = local_10;
    local_d6 = true;
    pVar4 = std::make_pair<unsigned_long&,bool>((unsigned_long *)&p.second,&local_d6);
    local_a0 = pVar4.second;
  }
LAB_004fbf09:
  this_local = (CodedInputStream *)pVar4.first;
  pVar5._9_7_ = pVar4._9_7_;
  pVar5.second = local_a0;
  pVar5.first = (unsigned_long)this_local;
  return pVar5;
}

Assistant:

std::pair<uint64_t, bool> CodedInputStream::ReadVarint64Fallback() {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    uint64_t temp;
    ::std::pair<bool, const uint8_t*> p = ReadVarint64FromArray(buffer_, &temp);
    if (!p.first) {
      return std::make_pair(0, false);
    }
    buffer_ = p.second;
    return std::make_pair(temp, true);
  } else {
    uint64_t temp;
    bool success = ReadVarint64Slow(&temp);
    return std::make_pair(temp, success);
  }
}